

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O2

void __thiscall TestOutput::printCurrentTestEnded(TestOutput *this,TestResult *res)

{
  long lVar1;
  
  if (this->verbose_ == true) {
    (*this->_vptr_TestOutput[0xb])(this," - ");
    lVar1 = TestResult::getCurrentTestTotalExecutionTime(res);
    (*this->_vptr_TestOutput[0xc])(this,lVar1);
    (*this->_vptr_TestOutput[0xb])(this," ms\n");
    return;
  }
  (*this->_vptr_TestOutput[0x14])(this);
  return;
}

Assistant:

void TestOutput::printCurrentTestEnded(const TestResult& res)
{
    if (verbose_) {
        print(" - ");
        print(res.getCurrentTestTotalExecutionTime());
        print(" ms\n");
    }
    else {
        printProgressIndicator();
    }
}